

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O0

void do_clear_area(int scol,int srow,int range,_func_void_int_int_void_ptr *func,void *arg)

{
  char cVar1;
  int local_54;
  char *limits;
  int offset;
  int max_y;
  int max_x;
  int min_x;
  int y;
  int x;
  void *arg_local;
  _func_void_int_int_void_ptr *func_local;
  int range_local;
  int srow_local;
  int scol_local;
  
  if ((scol == u.ux) && (srow == u.uy)) {
    if ((0xf < range) || (range < 1)) {
      panic("do_clear_area:  illegal range %d",(ulong)(uint)range);
    }
    if (vision_full_recalc != '\0') {
      vision_recalc(0);
    }
    cVar1 = ""[range];
    limits._4_4_ = srow + range;
    if (0x14 < limits._4_4_) {
      limits._4_4_ = 0x14;
    }
    max_x = srow - range;
    if (max_x < 0) {
      max_x = 0;
    }
    for (; max_x <= limits._4_4_; max_x = max_x + 1) {
      if (max_x - srow < 0) {
        local_54 = -(max_x - srow);
      }
      else {
        local_54 = max_x - srow;
      }
      max_y = scol - "\x01\x01\x02\x02\x01\x03\x03\x02\x01\x04\x04\x04\x03\x02\x05\x05\x05\x04\x03\x02\x06\x06\x06\x05\x05\x04\x02\a\a\a\x06\x06\x05\x04\x02\b\b\b\a\a\x06\x06\x04\x02\t\t\t\t\b\b\a\x06\x05\x03\n\n\n\n\t\t\b\a\x06\x05\x03\v\v\v\v\n\n\t\t\b\a\x05\x03\f\f\f\f\v\v\n\n\t\b\a\x05\x03\r\r\r\r\f\f\f\v\n\n\t\a\x06\x03\x0e\x0e\x0e\x0e\r\r\r\f\f\v\n\t\b\x06\x03\x0f\x0f\x0f\x0f\x0e\x0e\x0e\r\r\f\v\n\t\b\x06\x03\x10"
                     [(long)local_54 + (long)(int)cVar1];
      if (max_y < 0) {
        max_y = 0;
      }
      offset = scol + "\x01\x01\x02\x02\x01\x03\x03\x02\x01\x04\x04\x04\x03\x02\x05\x05\x05\x04\x03\x02\x06\x06\x06\x05\x05\x04\x02\a\a\a\x06\x06\x05\x04\x02\b\b\b\a\a\x06\x06\x04\x02\t\t\t\t\b\b\a\x06\x05\x03\n\n\n\n\t\t\b\a\x06\x05\x03\v\v\v\v\n\n\t\t\b\a\x05\x03\f\f\f\f\v\v\n\n\t\b\a\x05\x03\r\r\r\r\f\f\f\v\n\n\t\a\x06\x03\x0e\x0e\x0e\x0e\r\r\r\f\f\v\n\t\b\x06\x03\x0f\x0f\x0f\x0f\x0e\x0e\x0e\r\r\f\v\n\t\b\x06\x03\x10"
                      [(long)local_54 + (long)(int)cVar1];
      if (0x4f < offset) {
        offset = 0x4f;
      }
      for (min_x = max_y; min_x <= offset; min_x = min_x + 1) {
        if ((viz_array[max_x][min_x] & 1U) != 0) {
          (*func)(min_x,max_x,arg);
        }
      }
    }
  }
  else {
    view_from(srow,scol,(char **)0x0,(char *)0x0,(char *)0x0,range,func,arg);
  }
  return;
}

Assistant:

void do_clear_area(int scol, int srow, int range,
		   void (*func)(int,int,void *), void *arg)
{
	/* If not centered on hero, do the hard work of figuring the area */
	if (scol != u.ux || srow != u.uy)
	    view_from(srow, scol, NULL, NULL, NULL,
							range, func, arg);
	else {
	    int x;
	    int y, min_x, max_x, max_y, offset;
	    const char *limits;

	    if (range > MAX_RADIUS || range < 1)
		panic("do_clear_area:  illegal range %d", range);
	    if (vision_full_recalc)
		vision_recalc(0);	/* recalc vision if dirty */
	    limits = circle_ptr(range);
	    if ((max_y = (srow + range)) >= ROWNO) max_y = ROWNO-1;
	    if ((y = (srow - range)) < 0) y = 0;
	    for (; y <= max_y; y++) {
		offset = limits[v_abs(y-srow)];
		if ((min_x = (scol - offset)) < 0) min_x = 0;
		if ((max_x = (scol + offset)) >= COLNO) max_x = COLNO-1;
		for (x = min_x; x <= max_x; x++)
		    if (couldsee(x, y))
			(*func)(x, y, arg);
	    }
	}
}